

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptArray.cpp
# Opt level: O2

Var __thiscall
Js::JavascriptNativeFloatArray::DirectGetItem(JavascriptNativeFloatArray *this,uint32 index)

{
  int iVar1;
  SparseArraySegmentBase *pSVar2;
  Var pvVar3;
  uint uVar4;
  Type *pTVar5;
  Type local_28;
  Var element;
  
  pSVar2 = JavascriptArray::GetLastUsedSegment((JavascriptArray *)this);
  uVar4 = index - pSVar2->left;
  if ((pSVar2->left <= index) && (uVar4 < pSVar2->length)) {
    if (*(undefined1 **)(&pSVar2[1].left + (ulong)uVar4 * 2) != &DAT_fff80002fff80002) {
      pvVar3 = JavascriptNumber::ToVarWithCheck
                         ((double)*(undefined1 **)(&pSVar2[1].left + (ulong)uVar4 * 2),
                          (((((this->super_JavascriptNativeArray).super_JavascriptArray.
                              super_ArrayObject.super_DynamicObject.super_RecyclableObject.type.ptr)
                            ->javascriptLibrary).ptr)->super_JavascriptLibraryBase).scriptContext.
                          ptr);
      return pvVar3;
    }
  }
  pTVar5 = &local_28;
  local_28.ptr = (RecyclableObject *)0x0;
  iVar1 = (**(code **)((long)(this->super_JavascriptNativeArray).super_JavascriptArray.
                             super_ArrayObject.super_DynamicObject.super_RecyclableObject.
                             super_FinalizableObject.super_IRecyclerVisitedObject + 0x388))
                    (this,index,pTVar5);
  if (iVar1 == 0) {
    pTVar5 = &(((((this->super_JavascriptNativeArray).super_JavascriptArray.super_ArrayObject.
                  super_DynamicObject.super_RecyclableObject.type.ptr)->javascriptLibrary).ptr)->
              super_JavascriptLibraryBase).undefinedValue;
  }
  return pTVar5->ptr;
}

Assistant:

Var JavascriptNativeFloatArray::DirectGetItem(uint32 index)
    {
        SparseArraySegment<double> *seg = (SparseArraySegment<double>*)this->GetLastUsedSegment();
        uint32 offset = index - seg->left;
        if (index >= seg->left && offset < seg->length)
        {
            if (!SparseArraySegment<double>::IsMissingItem(&seg->elements[offset]))
            {
                return JavascriptNumber::ToVarWithCheck(seg->elements[offset], GetScriptContext());
            }
        }
        Var element = nullptr;
        if (DirectGetItemAtFull(index, &element))
        {
            return element;
        }
        return GetType()->GetLibrary()->GetUndefined();
    }